

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlSubstitutionItem::DebugXmlLhs
          (GdlSubstitutionItem *this,GrcManager *param_2,ofstream *strmOut,string *param_4)

{
  ostream *poVar1;
  ostream *in_RDX;
  long in_RDI;
  GrcSymbolTableEntry *in_stack_00000018;
  string local_40 [64];
  
  poVar1 = std::operator<<(in_RDX,"          <lhsSlot className=\"");
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(in_stack_00000018);
  poVar1 = std::operator<<(poVar1,local_40);
  poVar1 = std::operator<<(poVar1,"\" slotIndex=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x30) + 1);
  std::operator<<(poVar1,"\" />\n");
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void GdlSubstitutionItem::DebugXmlLhs(GrcManager * /*pcman*/, std::ofstream & strmOut,
	std::string /*staPathToCur*/)
{
	strmOut << "          <lhsSlot className=\"" << m_psymInput->FullAbbrev()
		<< "\" slotIndex=\"" << m_iritContextPos + 1 << "\" />\n";
}